

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::RenameEmpty(string *__return_storage_ptr__,string *name)

{
  bool bVar1;
  allocator local_11;
  
  bVar1 = std::operator==(name,"Empty");
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"GPBEmpty",&local_11);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RenameEmpty(const std::string& name) {
  if (name == "Empty") {
    return "GPBEmpty";
  } else {
    return name;
  }
}